

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenVectorForceAlign
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field,string *field_size)

{
  string *psVar1;
  bool bVar2;
  Value *pVVar3;
  char *pcVar4;
  int local_23c;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  byte local_d3;
  byte local_d2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string *local_90;
  string *type;
  Type vtype;
  int align;
  allocator<char> local_51;
  string local_50;
  Value *local_30;
  Value *force_align;
  string *field_size_local;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  force_align = (Value *)field_size;
  field_size_local = (string *)field;
  field_local = (FieldDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  bVar2 = IsVector(&(field->value).type);
  if (bVar2) {
    psVar1 = field_size_local + 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"force_align",&local_51);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                       ((SymbolTable<flatbuffers::Value> *)((long)&psVar1->field_2 + 8),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    local_30 = pVVar3;
    if (pVVar3 == (Value *)0x0) {
      local_23c = 1;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_23c = atoi(pcVar4);
    }
    vtype._24_4_ = local_23c;
    if (local_23c < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_201);
      std::allocator<char>::~allocator(&local_201);
    }
    else {
      Type::VectorType((Type *)&type,(Type *)&field_size_local[6]._M_string_length);
      bVar2 = IsStruct((Type *)&type);
      local_d2 = 0;
      local_d3 = 0;
      if (bVar2) {
        std::allocator<char>::allocator();
        local_d2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
        local_d3 = 1;
        BaseGenerator::WrapInNameSpace
                  (&local_b0,&this->super_BaseGenerator,(Definition *)vtype._0_8_,&local_d0);
      }
      else {
        GenTypeWire_abi_cxx11_
                  (&local_b0,this,(Type *)&type,"",false,
                   (bool)(field_size_local[8].field_2._M_local_buf[5] & 1));
      }
      if ((local_d3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_d0);
      }
      if ((local_d2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_d1);
      }
      local_90 = &local_b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"_fbb.ForceVectorAlignment",&local_1d9);
      pcVar4 = "";
      if ((field_size_local[8].field_2._M_local_buf[5] & 1U) != 0) {
        pcVar4 = "64";
      }
      std::operator+(&local_1b8,&local_1d8,pcVar4);
      std::operator+(&local_198,&local_1b8,"(");
      std::operator+(&local_178,&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     force_align);
      std::operator+(&local_158,&local_178,", sizeof(");
      std::operator+(&local_138,&local_158,local_90);
      std::operator+(&local_118,&local_138,"), ");
      std::__cxx11::to_string(&local_200,(long)(int)vtype._24_4_);
      std::operator+(&local_f8,&local_118,&local_200);
      std::operator+(__return_storage_ptr__,&local_f8,");");
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("IsVector(field.value.type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                ,0xb8b,
                "std::string flatbuffers::cpp::CppGenerator::GenVectorForceAlign(const FieldDef &, const std::string &)"
               );
}

Assistant:

std::string GenVectorForceAlign(const FieldDef &field,
                                  const std::string &field_size) {
    FLATBUFFERS_ASSERT(IsVector(field.value.type));
    // Get the value of the force_align attribute.
    const auto *force_align = field.attributes.Lookup("force_align");
    const int align = force_align ? atoi(force_align->constant.c_str()) : 1;
    // Generate code to do force_align for the vector.
    if (align > 1) {
      const auto vtype = field.value.type.VectorType();
      const std::string &type =
          IsStruct(vtype) ? WrapInNameSpace(*vtype.struct_def)
                          : GenTypeWire(vtype, "", false, field.offset64);
      return std::string("_fbb.ForceVectorAlignment") +
             (field.offset64 ? "64" : "") + "(" + field_size + ", sizeof(" +
             type + "), " + std::to_string(static_cast<long long>(align)) +
             ");";
    }
    return "";
  }